

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ieee.cc
# Opt level: O2

void TestSingle_IsNan(void)

{
  bool in_CL;
  
  CheckHelper((char *)0xeb,0xc1cb77,(char *)0x1,in_CL);
  CheckHelper((char *)0xed,0xc1cb95,(char *)0x1,in_CL);
  CheckHelper((char *)0xee,0xc1cbaf,(char *)0x1,in_CL);
  CheckHelper((char *)0xef,0xc1cbd3,(char *)0x1,in_CL);
  CheckHelper((char *)0xf0,0xc1cbf8,(char *)0x1,in_CL);
  CheckHelper((char *)0xf1,0xc1cc0e,(char *)0x1,in_CL);
  CheckHelper((char *)0xf2,0xc1cc25,(char *)0x1,in_CL);
  CheckHelper((char *)0xf3,0xc1cc3b,(char *)0x1,in_CL);
  CheckHelper((char *)0xf5,0xc1cc52,(char *)0x1,in_CL);
  return;
}

Assistant:

TEST(Single_IsNan) {
  CHECK(Single(Single::NaN()).IsNan());
  uint32_t other_nan = 0xFFFFF001;
  CHECK(Single(other_nan).IsNan());
  CHECK(!Single(Single::Infinity()).IsNan());
  CHECK(!Single(-Single::Infinity()).IsNan());
  CHECK(!Single(0.0f).IsNan());
  CHECK(!Single(-0.0f).IsNan());
  CHECK(!Single(1.0f).IsNan());
  CHECK(!Single(-1.0f).IsNan());
  uint32_t min_float32 = 0x00000001;
  CHECK(!Single(min_float32).IsNan());
}